

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtea.c
# Opt level: O1

int mbedtls_xtea_self_test(int verbose)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uchar (*key) [16];
  uchar buf [8];
  mbedtls_xtea_context ctx;
  long local_50;
  mbedtls_xtea_context local_48;
  
  local_48.k[0] = 0;
  local_48.k[1] = 0;
  local_48.k[2] = 0;
  local_48.k[3] = 0;
  uVar2 = 1;
  key = xtea_test_key;
  lVar3 = 0;
  do {
    if (verbose != 0) {
      printf("  XTEA test #%d: ",uVar2);
    }
    local_50 = *(long *)(xtea_test_pt[0] + lVar3);
    mbedtls_xtea_setup(&local_48,*key);
    mbedtls_xtea_crypt_ecb(&local_48,1,(uchar *)&local_50,(uchar *)&local_50);
    if (local_50 != *(long *)(xtea_test_ct[0] + lVar3)) {
      iVar1 = 1;
      if (verbose != 0) {
        puts("failed");
      }
      goto LAB_0010419c;
    }
    if (verbose != 0) {
      puts("passed");
    }
    uVar2 = (ulong)((int)uVar2 + 1);
    lVar3 = lVar3 + 8;
    key = key + 1;
  } while (lVar3 != 0x30);
  iVar1 = 0;
  if (verbose != 0) {
    putchar(10);
    iVar1 = 0;
  }
LAB_0010419c:
  mbedtls_platform_zeroize(&local_48,0x10);
  return iVar1;
}

Assistant:

int mbedtls_xtea_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char buf[8];
    mbedtls_xtea_context ctx;

    mbedtls_xtea_init( &ctx );
    for( i = 0; i < 6; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  XTEA test #%d: ", i + 1 );

        memcpy( buf, xtea_test_pt[i], 8 );

        mbedtls_xtea_setup( &ctx, xtea_test_key[i] );
        mbedtls_xtea_crypt_ecb( &ctx, MBEDTLS_XTEA_ENCRYPT, buf, buf );

        if( memcmp( buf, xtea_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_xtea_free( &ctx );

    return( ret );
}